

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  pIVar2 = GImGui;
  ppIVar1 = (GImGui->WindowsFocusOrder).Data;
  iVar5 = (GImGui->WindowsFocusOrder).Size;
  if (ppIVar1[(long)iVar5 + -1] != window && 1 < (long)iVar5) {
    uVar4 = (ulong)(iVar5 - 1);
    iVar5 = 1;
    do {
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
      if (ppIVar1[uVar4] == window) {
        memmove(ppIVar1 + uVar4,ppIVar1 + uVar4 + 1,(long)iVar5 << 3);
        (pIVar2->WindowsFocusOrder).Data[(long)(pIVar2->WindowsFocusOrder).Size + -1] = window;
        return;
      }
      iVar5 = iVar5 + 1;
    } while (0 < (int)uVar3);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}